

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
despot::Variable::ComputeIndexVec
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *vars,int index)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(long *)(vars + 8) - *(long *)vars >> 3,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = *(long *)vars;
  uVar4 = (ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2 & 0xffffffff;
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) break;
    uVar5 = (ulong)((uint)uVar4 & 0x7fffffff);
    lVar3 = *(long *)(lVar2 + uVar5 * 8);
    iVar6 = (int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 5);
    piVar1[uVar5] = index % iVar6;
    index = index / iVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Variable::ComputeIndexVec(const vector<StateVar*>& vars,
	int index) {
	vector<int> vec(vars.size());
	for (int i = vec.size() - 1; i >= 0; i--) {
		vec[i] = index % vars[i]->Size();
		index /= vars[i]->Size();
	}

	return vec;
}